

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
baryonyx::details::pi_pnm_observer::make_observation<double>
          (pi_pnm_observer *this,sparse_matrix<int> *param_1,double *param_2,double *pi)

{
  rgb rVar1;
  pnm_iterator_entry pVar2;
  int i;
  ulong uVar3;
  iterator it;
  _Head_base<0UL,_unsigned_char_*,_false> local_40;
  colormap local_38;
  
  local_40._M_head_impl =
       (this->m_pnm).m_buffer._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  local_38.m_lower = -1.0;
  local_38.m_upper = 1.0;
  for (uVar3 = 0; uVar3 != (uint)this->constraints; uVar3 = uVar3 + 1) {
    rVar1 = colormap::operator()(&local_38,pi[uVar3]);
    pVar2 = pnm_iterator::operator*((pnm_iterator *)&local_40);
    *pVar2.m_colors = rVar1.red;
    pVar2.m_colors[1] = rVar1.green;
    pVar2.m_colors[2] = rVar1.blue;
  }
  pnm_vector::flush(&this->m_pnm);
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& /*ap*/,
                          const Float* /*P*/,
                          const Float* pi)
    {
        static_assert(std::is_floating_point<Float>::value);

        auto it = m_pnm.begin();
        colormap fct(-1.f, +1.f);

        for (int i = 0; i != constraints; ++i)
            *it = fct(pi[i]);

        m_pnm.flush();
    }